

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O3

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlockHelper
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  HRESULT HVar1;
  
  if ((this->inStream).ptr == (IStream *)0x0) {
    HVar1 = ReadHeader(this);
    if (HVar1 < 0) {
      return HVar1;
    }
    if (((this->inStream).ptr == (IStream *)0x0) && (HVar1 = ReadHeader(this), HVar1 < 0)) {
      return HVar1;
    }
  }
  HVar1 = -0x7fffbffb;
  if (blockType == BlockType_Invalid) {
    HVar1 = 0;
    if (bytesInBlock != (ULONG *)0x0) {
      *bytesInBlock = 0;
      HVar1 = 0;
    }
  }
  return HVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlockHelper(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;
        BlockType currentBlockType = BlockType_Invalid;
        ULONG byteCount = 0;

        IFFAILRET(Read(&currentBlockType));
        IFFAILRET(Read(&byteCount));

        if (currentBlockType == blockType)
        {
            if (bytesInBlock != nullptr)
            {
                *bytesInBlock = byteCount;
            }
            return S_OK;
        }
        else if (currentBlockType == BlockType_Invalid || byteCount == 0)
        {
            return E_FAIL;
        }

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        // The block we're pointing at is not the requested one, seek forward to the next block
        LARGE_INTEGER dlibMove;
        dlibMove.QuadPart = byteCount;
        IFFAILRET(this->inStream->Seek(dlibMove, STREAM_SEEK_CUR, nullptr));
#endif

        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }